

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O3

void aom_highbd_comp_mask_pred_c
               (uint8_t *comp_pred8,uint8_t *pred8,int width,int height,uint8_t *ref8,int ref_stride
               ,uint8_t *mask,int mask_stride,int invert_mask)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  if (0 < height) {
    lVar5 = (long)comp_pred8 * 2;
    lVar6 = (long)ref8 * 2;
    lVar4 = (long)pred8 * 2;
    iVar7 = 0;
    do {
      if (0 < width) {
        lVar3 = lVar6;
        lVar1 = lVar4;
        if (invert_mask == 0) {
          lVar3 = lVar4;
          lVar1 = lVar6;
        }
        uVar2 = 0;
        do {
          *(short *)(lVar5 + uVar2 * 2) =
               (short)((uint)*(ushort *)(lVar1 + uVar2 * 2) * (uint)mask[uVar2] +
                       (uint)*(ushort *)(lVar3 + uVar2 * 2) * (0x40 - (uint)mask[uVar2]) + 0x20 >> 6
                      );
          uVar2 = uVar2 + 1;
        } while ((uint)width != uVar2);
      }
      lVar4 = lVar4 + (long)width * 2;
      lVar6 = lVar6 + (long)ref_stride * 2;
      mask = mask + mask_stride;
      iVar7 = iVar7 + 1;
      lVar5 = lVar5 + (long)width * 2;
    } while (iVar7 != height);
  }
  return;
}

Assistant:

void aom_highbd_comp_mask_pred_c(uint8_t *comp_pred8, const uint8_t *pred8,
                                 int width, int height, const uint8_t *ref8,
                                 int ref_stride, const uint8_t *mask,
                                 int mask_stride, int invert_mask) {
  int i, j;
  uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);
  uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
  uint16_t *comp_pred = CONVERT_TO_SHORTPTR(comp_pred8);
  for (i = 0; i < height; ++i) {
    for (j = 0; j < width; ++j) {
      if (!invert_mask)
        comp_pred[j] = AOM_BLEND_A64(mask[j], ref[j], pred[j]);
      else
        comp_pred[j] = AOM_BLEND_A64(mask[j], pred[j], ref[j]);
    }
    comp_pred += width;
    pred += width;
    ref += ref_stride;
    mask += mask_stride;
  }
}